

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int disposition_set_batchable(DISPOSITION_HANDLE disposition,_Bool batchable_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  DISPOSITION_INSTANCE *disposition_instance;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar2 = 0x2360;
  }
  else {
    item_value = amqpvalue_create_boolean(batchable_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x2368;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(disposition->composite_value,5,item_value);
      iVar2 = 0x236e;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int disposition_set_batchable(DISPOSITION_HANDLE disposition, bool batchable_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE batchable_amqp_value = amqpvalue_create_boolean(batchable_value);
        if (batchable_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 5, batchable_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(batchable_amqp_value);
        }
    }

    return result;
}